

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VScaleAddMulti(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int ier;
  int i;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (*(long *)(*(long *)(in_RDX + 8) + 0xf0) == 0) {
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      (**(code **)(*(long *)(in_RDX + 8) + 0x50))
                (*(undefined8 *)(in_RSI + (long)local_2c * 8),0x3ff0000000000000,in_RDX,
                 *(undefined8 *)(in_RCX + (long)local_2c * 8),
                 *(undefined8 *)(in_R8 + (long)local_2c * 8));
    }
    local_30 = 0;
  }
  else {
    local_30 = (**(code **)(*(long *)(in_RDX + 8) + 0xf0))(in_EDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_30;
}

Assistant:

int N_VScaleAddMulti(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvscaleaddmulti != NULL) {

    ier = x->ops->nvscaleaddmulti(nvec, a, x, Y, Z);

  } else {

    for (i=0; i<nvec; i++) {
      x->ops->nvlinearsum(a[i], x, RCONST(1.0), Y[i], Z[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(ier);
}